

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectInvariants
          (Interpreter *this,HeapObject *curr,HeapObject *self,uint *counter,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *thunks)

{
  AST *body;
  bool bVar1;
  long lVar2;
  HeapThunk *this_00;
  _Base_ptr p_Var3;
  long *plVar4;
  Value v;
  HeapThunk *local_68;
  HeapObject *local_60;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *local_58;
  Stack *local_50;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *local_48;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *local_40;
  long *local_38;
  
  local_60 = self;
  local_58 = thunks;
  do {
    if (curr == (HeapObject *)0x0) {
LAB_001ca0f3:
      *counter = *counter + 1;
      return;
    }
    lVar2 = __dynamic_cast(curr,&(anonymous_namespace)::HeapObject::typeinfo,
                           &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
    if (lVar2 == 0) {
      lVar2 = __dynamic_cast(curr,&(anonymous_namespace)::HeapObject::typeinfo,
                             &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
      if (lVar2 != 0) {
        plVar4 = (long *)(lVar2 + 0x70);
        local_48 = &(this->heap).entities;
        local_50 = &this->stack;
        local_40 = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)(lVar2 + 0x10);
        local_38 = plVar4;
        while (plVar4 = (long *)*plVar4, plVar4 != local_38) {
          body = (AST *)plVar4[2];
          this_00 = (HeapThunk *)operator_new(0x70);
          HeapThunk::HeapThunk(this_00,this->idInvariant,local_60,*counter,body);
          local_68 = this_00;
          std::
          vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
          ::push_back(local_48,(value_type *)&local_68);
          (this_00->super_HeapEntity).mark = (this->heap).lastMark;
          (this->heap).numEntities =
               (long)(this->heap).entities.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->heap).entities.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
          bVar1 = Heap::checkHeap(&this->heap);
          if (bVar1) {
            Heap::markFrom(&this->heap,(HeapEntity *)this_00);
            Stack::mark(local_50,&this->heap);
            v._4_4_ = 0;
            v.t = (this->scratch).t;
            v.v.h = (this->scratch).v.h;
            Heap::markFrom(&this->heap,v);
            for (p_Var3 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                ; (_Rb_tree_header *)p_Var3 !=
                  &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
              if (*(HeapEntity **)(*(long *)(p_Var3 + 3) + 0x40) != (HeapEntity *)0x0) {
                Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var3 + 3) + 0x40));
              }
            }
            for (p_Var3 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var3 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
              Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var3 + 2));
            }
            Heap::sweep(&this->heap);
          }
          local_68 = this_00;
          std::
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          ::operator=(&this_00->upValues,local_40);
          std::
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ::push_back(local_58,&local_68);
        }
      }
      goto LAB_001ca0f3;
    }
    objectInvariants(this,*(HeapObject **)(lVar2 + 0x18),local_60,counter,local_58);
    curr = *(HeapObject **)(lVar2 + 0x10);
  } while( true );
}

Assistant:

void objectInvariants(HeapObject *curr, HeapObject *self, unsigned &counter,
                          std::vector<HeapThunk *> &thunks)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            objectInvariants(ext->right, self, counter, thunks);
            objectInvariants(ext->left, self, counter, thunks);
        } else {
            if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                for (AST *assert : simp->asserts) {
                    auto *el_th = makeHeap<HeapThunk>(idInvariant, self, counter, assert);
                    el_th->upValues = simp->upValues;
                    thunks.push_back(el_th);
                }
            }
            counter++;
        }
    }